

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

void wallscan_striped(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,double yrepeat
                     )

{
  FDynamicColormap *pFVar1;
  bool foggy;
  int iVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  lightlist_t *plVar6;
  short *local_8788;
  lightlist_t *lit;
  int j_1;
  int j;
  uint i;
  short *down;
  short *up;
  short most3 [5760];
  short most2 [5760];
  short most1 [5760];
  bool fogginess;
  int startshade;
  FDynamicColormap *startcolormap;
  double yrepeat_local;
  fixed_t *lwal_local;
  float *swal_local;
  short *dwal_local;
  short *uwal_local;
  int x2_local;
  int x1_local;
  
  iVar2 = wallshade;
  foggy = ::foggy;
  pFVar1 = basecolormap;
  _j = most2 + 0x167c;
  if (x1 < WallC.sx1) {
    __assert_fail("WallC.sx1 <= x1",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                  ,0x4ea,
                  "void wallscan_striped(int, int, short *, short *, float *, fixed_t *, double)");
  }
  if (WallC.sx2 < x2) {
    __assert_fail("WallC.sx2 >= x2",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                  ,0x4eb,
                  "void wallscan_striped(int, int, short *, short *, float *, fixed_t *, double)");
  }
  down = uwal;
  for (j_1 = 0; uVar4 = TArray<lightlist_t,_lightlist_t>::Size(&(frontsector->e->XFloor).lightlist),
      (uint)j_1 < uVar4; j_1 = j_1 + 1) {
    plVar6 = TArray<lightlist_t,_lightlist_t>::operator[]
                       (&(frontsector->e->XFloor).lightlist,(ulong)(uint)j_1);
    iVar5 = WallMost((short *)&up,&plVar6->plane,&WallC);
    lit._4_4_ = x1;
    if (iVar5 != 3) {
      for (; lit._4_4_ < x2; lit._4_4_ = lit._4_4_ + 1) {
        sVar3 = clamp<short>(most3[(long)lit._4_4_ + -4],down[lit._4_4_],dwal[lit._4_4_]);
        _j[lit._4_4_] = sVar3;
      }
      wallscan(x1,x2,down,_j,swal,lwal,yrepeat,R_GetColumn);
      down = _j;
      if (_j == most2 + 0x167c) {
        local_8788 = most3;
      }
      else {
        local_8788 = most2;
      }
      local_8788 = local_8788 + 0x167c;
      _j = local_8788;
    }
    plVar6 = TArray<lightlist_t,_lightlist_t>::operator[]
                       (&(frontsector->e->XFloor).lightlist,(ulong)(uint)j_1);
    basecolormap = plVar6->extra_colormap;
    iVar5 = side_t::GetLightLevel
                      (curline->sidedef,foggy,(int)*plVar6->p_lightlevel,
                       plVar6->lightsource != (F3DFloor *)0x0,(int *)0x0);
    wallshade = (iVar5 + r_actualextralight + 0xc) * -0x4000 + 0x400000;
  }
  wallscan(x1,x2,down,dwal,swal,lwal,yrepeat,R_GetColumn);
  basecolormap = pFVar1;
  wallshade = iVar2;
  return;
}

Assistant:

void wallscan_striped (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat)
{
	FDynamicColormap *startcolormap = basecolormap;
	int startshade = wallshade;
	bool fogginess = foggy;

	short most1[MAXWIDTH], most2[MAXWIDTH], most3[MAXWIDTH];
	short *up, *down;

	up = uwal;
	down = most1;

	assert(WallC.sx1 <= x1);
	assert(WallC.sx2 >= x2);

	// kg3D - fake floors instead of zdoom light list
	for (unsigned int i = 0; i < frontsector->e->XFloor.lightlist.Size(); i++)
	{
		int j = WallMost (most3, frontsector->e->XFloor.lightlist[i].plane, &WallC);
		if (j != 3)
		{
			for (int j = x1; j < x2; ++j)
			{
				down[j] = clamp (most3[j], up[j], dwal[j]);
			}
			wallscan (x1, x2, up, down, swal, lwal, yrepeat);
			up = down;
			down = (down == most1) ? most2 : most1;
		}

		lightlist_t *lit = &frontsector->e->XFloor.lightlist[i];
		basecolormap = lit->extra_colormap;
		wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(fogginess,
			*lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
 	}

	wallscan (x1, x2, up, dwal, swal, lwal, yrepeat);
	basecolormap = startcolormap;
	wallshade = startshade;
}